

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::SharedCtor(FieldOptions *this)

{
  this->_cached_size_ = 0;
  this->ctype_ = 0;
  this->packed_ = false;
  this->lazy_ = false;
  this->deprecated_ = false;
  this->weak_ = false;
  this->jstype_ = 0;
  return;
}

Assistant:

void FieldOptions::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&ctype_, 0, reinterpret_cast<char*>(&jstype_) -
    reinterpret_cast<char*>(&ctype_) + sizeof(jstype_));
}